

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void Js::InterpreterStackFrame::TraceAsmJsOpCode(InterpreterStackFrame *that,OpCodeAsmJs op)

{
  uint uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  long lVar7;
  char16 *pcVar8;
  
  uVar5 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  lVar2 = *(long *)(that + 0x88);
  lVar7 = *(long *)(lVar2 + 0x10);
  if (lVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_009899ce;
    *puVar6 = 0;
    lVar7 = *(long *)(lVar2 + 0x10);
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015b6718,AsmjsInterpreterPhase,uVar5,
                            *(LocalFunctionId *)(lVar7 + 0x10));
  if (!bVar4) {
    return;
  }
  uVar5 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  lVar2 = *(long *)(that + 0x88);
  lVar7 = *(long *)(lVar2 + 0x10);
  if (lVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
LAB_009899ce:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    lVar7 = *(long *)(lVar2 + 0x10);
  }
  uVar1 = *(uint *)(lVar7 + 0x10);
  pcVar8 = OpCodeUtilAsmJs::GetOpCodeName(op);
  Output::Print(L"%d.%d:Executing %s at offset 0x%X\n",(ulong)uVar5,(ulong)uVar1,pcVar8,
                *(undefined8 *)(that + 0x108));
  return;
}

Assistant:

void InterpreterStackFrame::TraceAsmJsOpCode(InterpreterStackFrame* that, Js::OpCodeAsmJs op)
    {
#if DBG_DUMP && defined(ASMJS_PLAT)
        if (PHASE_TRACE(Js::AsmjsInterpreterPhase, that->m_functionBody))
        {
            Output::Print(_u("%d.%d:Executing %s at offset 0x%X\n"), that->m_functionBody->GetSourceContextId(), that->m_functionBody->GetLocalFunctionId(), Js::OpCodeUtilAsmJs::GetOpCodeName(op), that->DEBUG_currentByteOffset);
        }
#endif
    }